

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SEQUENCE_OF.c
# Opt level: O3

asn_enc_rval_t *
SEQUENCE_OF_encode_uper
          (asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,
          asn_per_constraints_t *constraints,void *sptr,asn_per_outp_t *po)

{
  asn_TYPE_member_s *paVar1;
  long lVar2;
  void *pvVar3;
  asn_TYPE_descriptor_s *paVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  ssize_t sVar8;
  int iVar9;
  ulong uVar10;
  asn_per_constraint_s *local_58;
  asn_enc_rval_t local_48;
  
  if (sptr == (void *)0x0) {
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = (void *)0x0;
    return __return_storage_ptr__;
  }
  paVar1 = td->elements;
  if ((constraints == (asn_per_constraints_t *)0x0) &&
     (constraints = td->per_constraints, constraints == (asn_per_constraints_t *)0x0)) {
LAB_001454ef:
    bVar5 = true;
    local_58 = (asn_per_constraint_s *)0x0;
    goto LAB_00145501;
  }
  local_58 = &constraints->size;
  lVar7 = (long)*(int *)((long)sptr + 8);
  if (lVar7 < (constraints->size).lower_bound) {
    if ((local_58->flags & APC_EXTENSIBLE) == APC_UNCONSTRAINED) {
LAB_0014542f:
      if (-1 < (constraints->size).effective_bits) {
        __return_storage_ptr__->encoded = -1;
        __return_storage_ptr__->failed_type = td;
        goto LAB_001454cd;
      }
      goto LAB_0014548c;
    }
    iVar6 = per_put_few_bits(po,1,1);
    if (iVar6 == 0) goto LAB_001454ef;
  }
  else {
    lVar2 = (constraints->size).upper_bound;
    if (((constraints->size).flags & APC_EXTENSIBLE) == APC_UNCONSTRAINED) {
      if (lVar2 < lVar7) goto LAB_0014542f;
    }
    else {
      iVar6 = per_put_few_bits(po,(uint)(lVar2 < lVar7),1);
      if (iVar6 != 0) goto LAB_001454b9;
      if (lVar2 < lVar7) goto LAB_001454ef;
    }
LAB_0014548c:
    iVar6 = (constraints->size).effective_bits;
    if ((iVar6 < 0) ||
       (iVar6 = per_put_few_bits(po,*(int *)((long)sptr + 8) - (int)(constraints->size).lower_bound,
                                 iVar6), iVar6 == 0)) {
      bVar5 = false;
LAB_00145501:
      iVar6 = *(int *)((long)sptr + 8);
      if (iVar6 < 0) {
        sVar8 = 0;
      }
      else {
        uVar10 = 0xffffffff;
        sVar8 = 0;
        do {
          iVar9 = (int)uVar10;
          uVar10 = uVar10 & 0xffffffff;
          if (iVar9 < 1) {
            uVar10 = 0;
          }
          if ((bVar5) || (local_58->effective_bits < 0)) {
            lVar7 = uper_put_length(po,(long)(iVar6 - (int)uVar10));
            if (lVar7 < 0) goto LAB_001454b9;
          }
          else {
            lVar7 = (long)iVar6;
          }
          for (; lVar7 != 0; lVar7 = lVar7 + -1) {
            pvVar3 = *(void **)(*sptr + uVar10 * 8);
            if ((pvVar3 == (void *)0x0) ||
               (paVar4 = paVar1->type,
               (*paVar4->uper_encoder)(&local_48,paVar4,paVar1->per_constraints,pvVar3,po),
               local_48.encoded == -1)) goto LAB_001454b9;
            uVar10 = uVar10 + 1;
            sVar8 = local_48.encoded;
          }
          iVar6 = *(int *)((long)sptr + 8);
        } while ((int)uVar10 < iVar6);
      }
      __return_storage_ptr__->encoded = sVar8;
      __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
      __return_storage_ptr__->structure_ptr = (void *)0x0;
      return __return_storage_ptr__;
    }
  }
LAB_001454b9:
  __return_storage_ptr__->encoded = -1;
  __return_storage_ptr__->failed_type = td;
LAB_001454cd:
  __return_storage_ptr__->structure_ptr = sptr;
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
SEQUENCE_OF_encode_uper(asn_TYPE_descriptor_t *td,
	asn_per_constraints_t *constraints, void *sptr, asn_per_outp_t *po) {
	asn_anonymous_sequence_ *list;
	asn_per_constraint_t *ct;
	asn_enc_rval_t er;
	asn_TYPE_member_t *elm = td->elements;
	int seq;

	if(!sptr) ASN__ENCODE_FAILED;
	list = _A_SEQUENCE_FROM_VOID(sptr);

	er.encoded = 0;

	ASN_DEBUG("Encoding %s as SEQUENCE OF (%d)", td->name, list->count);

	if(constraints) ct = &constraints->size;
	else if(td->per_constraints) ct = &td->per_constraints->size;
	else ct = 0;

	/* If extensible constraint, check if size is in root */
	if(ct) {
		int not_in_root = (list->count < ct->lower_bound
				|| list->count > ct->upper_bound);
		ASN_DEBUG("lb %ld ub %ld %s",
			ct->lower_bound, ct->upper_bound,
			ct->flags & APC_EXTENSIBLE ? "ext" : "fix");
		if(ct->flags & APC_EXTENSIBLE) {
			/* Declare whether size is in extension root */
			if(per_put_few_bits(po, not_in_root, 1))
				ASN__ENCODE_FAILED;
			if(not_in_root) ct = 0;
		} else if(not_in_root && ct->effective_bits >= 0)
			ASN__ENCODE_FAILED;
	}

	if(ct && ct->effective_bits >= 0) {
		/* X.691, #19.5: No length determinant */
		if(per_put_few_bits(po, list->count - ct->lower_bound,
				ct->effective_bits))
			ASN__ENCODE_FAILED;
	}

	for(seq = -1; seq < list->count;) {
		ssize_t mayEncode;
		if(seq < 0) seq = 0;
		if(ct && ct->effective_bits >= 0) {
			mayEncode = list->count;
		} else {
			mayEncode = uper_put_length(po, list->count - seq);
			if(mayEncode < 0) ASN__ENCODE_FAILED;
		}

		while(mayEncode--) {
			void *memb_ptr = list->array[seq++];
			if(!memb_ptr) ASN__ENCODE_FAILED;
			er = elm->type->uper_encoder(elm->type,
				elm->per_constraints, memb_ptr, po);
			if(er.encoded == -1)
				ASN__ENCODE_FAILED;
		}
	}

	ASN__ENCODED_OK(er);
}